

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  ZSTD_parameters params;
  ZSTD_CCtx_params ret;
  ZSTD_CCtx_params in_stack_fffffffffffffe90;
  ZSTD_compressionParameters local_d8;
  undefined4 local_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined1 local_b0 [32];
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  
  bVar5 = 0;
  sVar1 = dictSize;
  if (dict == (void *)0x0) {
    sVar1 = 0;
  }
  ZSTD_getCParams(&local_d8,compressionLevel,srcSize + (srcSize == 0),sVar1);
  uStack_b8 = 0;
  uStack_b4 = 0;
  local_bc = 1;
  memcpy(local_b0,&cctx->requestedParams,0x80);
  local_b0._4_4_ = local_d8.windowLog;
  local_b0._8_4_ = local_d8.chainLog;
  local_b0._24_4_ = local_d8.targetLength;
  local_b0._28_4_ = local_d8.strategy;
  local_90 = CONCAT44(uStack_b8,local_bc);
  local_88 = uStack_b4;
  local_84 = 3;
  puVar3 = (undefined8 *)local_b0;
  puVar4 = (undefined8 *)&stack0xfffffffffffffe90;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  sVar1 = ZSTD_compress_advanced_internal
                    (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,in_stack_fffffffffffffe90);
  return sVar1;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, srcSize + (!srcSize), dict ? dictSize : 0);
    ZSTD_CCtx_params cctxParams = ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    assert(params.fParams.contentSizeFlag == 1);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, cctxParams);
}